

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

NetType_conflict __thiscall cfd::core::AddressFormatData::GetNetType(AddressFormatData *this)

{
  bool bVar1;
  NetType_conflict NVar2;
  allocator local_51;
  string net_type;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"nettype",&local_51);
  GetString(&net_type,this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  bVar1 = ::std::operator==(&net_type,"mainnet");
  NVar2 = kCfdSuccess;
  if (!bVar1) {
    bVar1 = ::std::operator==(&net_type,"testnet");
    if (bVar1) {
      NVar2 = kCfdIllegalArgumentError;
    }
    else {
      bVar1 = ::std::operator==(&net_type,"regtest");
      if (bVar1) {
        NVar2 = kCfdIllegalStateError;
      }
      else {
        bVar1 = ::std::operator==(&net_type,"liquidv1");
        if (bVar1) {
          NVar2 = kCfdOutOfRangeError;
        }
        else {
          bVar1 = ::std::operator==(&net_type,"elementsregtest");
          NVar2 = (uint)bVar1 ^ kCfdConnectionError;
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&net_type);
  return NVar2;
}

Assistant:

NetType AddressFormatData::GetNetType() const {
  std::string net_type = GetString(kNettype);
  NetType result = NetType::kCustomChain;
  if (net_type == kNettypeMainnet) {
    result = NetType::kMainnet;
  } else if (net_type == kNettypeTestnet) {
    result = NetType::kTestnet;
  } else if (net_type == kNettypeRegtest) {
    result = NetType::kRegtest;
  } else {
#ifndef CFD_DISABLE_ELEMENTS
    if (net_type == kNettypeLiquidV1) {
      result = NetType::kLiquidV1;
    } else if (net_type == kNettypeElementsRegtest) {
      result = NetType::kElementsRegtest;
    }
#endif  // CFD_DISABLE_ELEMENTS
  }
  return result;
}